

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

char * __thiscall cmState::GetCacheEntryProperty(cmState *this,string *key,string *propertyName)

{
  cmCacheManager *this_00;
  bool bVar1;
  char *key_00;
  undefined1 local_38 [8];
  CacheIterator it;
  string *propertyName_local;
  string *key_local;
  cmState *this_local;
  
  this_00 = this->CacheManager;
  it.Position._M_node = (_Base_ptr)propertyName;
  key_00 = (char *)std::__cxx11::string::c_str();
  _local_38 = cmCacheManager::GetCacheIterator(this_00,key_00);
  bVar1 = cmCacheManager::CacheIterator::PropertyExists
                    ((CacheIterator *)local_38,(string *)it.Position._M_node);
  if (bVar1) {
    this_local = (cmState *)
                 cmCacheManager::CacheIterator::GetProperty
                           ((CacheIterator *)local_38,(string *)it.Position._M_node);
  }
  else {
    this_local = (cmState *)0x0;
  }
  return (char *)this_local;
}

Assistant:

const char* cmState::GetCacheEntryProperty(std::string const& key,
                                           std::string const& propertyName)
{
  cmCacheManager::CacheIterator it =
    this->CacheManager->GetCacheIterator(key.c_str());
  if (!it.PropertyExists(propertyName)) {
    return nullptr;
  }
  return it.GetProperty(propertyName);
}